

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O1

ParseStatus
duckdb_re2::ParseUnicodeGroup
          (StringPiece *s,ParseFlags parse_flags,CharClassBuilder *cc,RegexpStatus *status)

{
  byte bVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  uint sign;
  undefined1 *g;
  Rune c;
  int local_5c;
  StringPiece local_58;
  StringPiece local_48;
  
  if ((parse_flags >> 10 & 1) == 0) {
    return kParseNothing;
  }
  if (s->size_ < 2) {
    return kParseNothing;
  }
  pcVar2 = s->data_;
  if (*pcVar2 != '\\') {
    return kParseNothing;
  }
  bVar1 = pcVar2[1];
  local_5c = (int)(char)bVar1;
  if ((bVar1 & 0xdf) != 0x50) {
    return kParseNothing;
  }
  local_48.data_ = s->data_;
  local_48.size_ = s->size_;
  local_58.data_ = (const_pointer)0x0;
  local_58.size_ = 0;
  s->data_ = pcVar2 + 2;
  s->size_ = s->size_ - 2;
  iVar4 = StringPieceToRune(&local_5c,s,status);
  if (iVar4 == 0) {
    return kParseError;
  }
  if (local_5c == 0x7b) {
    sVar5 = StringPiece::find(s,'}',0);
    if (sVar5 == 0xffffffffffffffff) {
      bVar3 = IsValidUTF8(&local_48,status);
      if (!bVar3) {
        return kParseError;
      }
      goto LAB_011f4c2e;
    }
    local_58.data_ = s->data_;
    s->data_ = local_58.data_ + sVar5 + 1;
    s->size_ = s->size_ - (sVar5 + 1);
    local_58.size_ = sVar5;
    bVar3 = IsValidUTF8(&local_58,status);
    if (!bVar3) {
      return kParseError;
    }
  }
  else {
    local_58.data_ = local_48.data_ + 2;
    local_58.size_ = (long)s->data_ - (long)local_58.data_;
  }
  local_48.size_ = (long)s->data_ - (long)local_48.data_;
  sign = (uint)(bVar1 != 0x50) * 2 - 1;
  if ((local_58.size_ != 0) && (*local_58.data_ == '^')) {
    sign = -(uint)(bVar1 != 0x50) | 1;
    local_58.data_ = local_58.data_ + 1;
    local_58.size_ = local_58.size_ - 1;
  }
  if ((local_58.size_ != 3) ||
     ((g = anygroup, local_58.data_ != "Any" && (iVar4 = bcmp(local_58.data_,"Any",3), iVar4 != 0)))
     ) {
    g = (undefined1 *)LookupGroup(&local_58,(UGroup *)unicode_groups,199);
  }
  if ((UGroup *)g != (UGroup *)0x0) {
    AddUGroup(cc,(UGroup *)g,sign,parse_flags);
    return kParseOk;
  }
LAB_011f4c2e:
  status->code_ = kRegexpBadCharRange;
  (status->error_arg_).data_ = local_48.data_;
  (status->error_arg_).size_ = local_48.size_;
  return kParseError;
}

Assistant:

ParseStatus ParseUnicodeGroup(StringPiece* s, Regexp::ParseFlags parse_flags,
                              CharClassBuilder *cc,
                              RegexpStatus* status) {
  // Decide whether to parse.
  if (!(parse_flags & Regexp::UnicodeGroups))
    return kParseNothing;
  if (s->size() < 2 || (*s)[0] != '\\')
    return kParseNothing;
  Rune c = (*s)[1];
  if (c != 'p' && c != 'P')
    return kParseNothing;

  // Committed to parse.  Results:
  int sign = +1;  // -1 = negated char class
  if (c == 'P')
    sign = -sign;
  StringPiece seq = *s;  // \p{Han} or \pL
  StringPiece name;  // Han or L
  s->remove_prefix(2);  // '\\', 'p'

  if (!StringPieceToRune(&c, s, status))
    return kParseError;
  if (c != '{') {
    // Name is the bit of string we just skipped over for c.
    const char* p = seq.data() + 2;
    name = StringPiece(p, static_cast<size_t>(s->data() - p));
  } else {
    // Name is in braces. Look for closing }
    size_t end = s->find('}', 0);
    if (end == StringPiece::npos) {
      if (!IsValidUTF8(seq, status))
        return kParseError;
      status->set_code(kRegexpBadCharRange);
      status->set_error_arg(seq);
      return kParseError;
    }
    name = StringPiece(s->data(), end);  // without '}'
    s->remove_prefix(end + 1);  // with '}'
    if (!IsValidUTF8(name, status))
      return kParseError;
  }

  // Chop seq where s now begins.
  seq = StringPiece(seq.data(), static_cast<size_t>(s->data() - seq.data()));

  if (!name.empty() && name[0] == '^') {
    sign = -sign;
    name.remove_prefix(1);  // '^'
  }

#if !defined(RE2_USE_ICU)
  // Look up the group in the RE2 Unicode data.
  const UGroup *g = LookupUnicodeGroup(name);
  if (g == NULL) {
    status->set_code(kRegexpBadCharRange);
    status->set_error_arg(seq);
    return kParseError;
  }

  AddUGroup(cc, g, sign, parse_flags);
#else
  // Look up the group in the ICU Unicode data. Because ICU provides full
  // Unicode properties support, this could be more than a lookup by name.
  ::icu::UnicodeString ustr = ::icu::UnicodeString::fromUTF8(
      std::string("\\p{") + std::string(name) + std::string("}"));
  UErrorCode uerr = U_ZERO_ERROR;
  ::icu::UnicodeSet uset(ustr, uerr);
  if (U_FAILURE(uerr)) {
    status->set_code(kRegexpBadCharRange);
    status->set_error_arg(seq);
    return kParseError;
  }

  // Convert the UnicodeSet to a URange32 and UGroup that we can add.
  int nr = uset.getRangeCount();
  PODArray<URange32> r(nr);
  for (int i = 0; i < nr; i++) {
    r[i].lo = uset.getRangeStart(i);
    r[i].hi = uset.getRangeEnd(i);
  }
  UGroup g = {"", +1, 0, 0, r.data(), nr};
  AddUGroup(cc, &g, sign, parse_flags);
#endif

  return kParseOk;
}